

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling3d.cpp
# Opt level: O3

int __thiscall ncnn::Pooling3D::forward(Pooling3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  int *piVar11;
  int ki;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  void *pvVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  void *pvVar29;
  int iVar30;
  int iVar31;
  void *pvVar32;
  int iVar33;
  uint uVar34;
  int iVar35;
  uint uVar36;
  int iVar37;
  uint uVar38;
  ulong uVar39;
  bool bVar40;
  float fVar41;
  Mat m;
  Mat m_2;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_pad;
  void *local_240;
  void *local_238;
  int local_230;
  int local_22c;
  long local_220;
  ulong local_218;
  void *local_210;
  ulong local_1f8;
  ulong local_1c0;
  long local_1a8;
  long local_1a0;
  Mat local_188;
  long local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  Mat local_120;
  Mat local_d8;
  vector<int,_std::allocator<int>_> local_90;
  Option local_78;
  
  iVar20 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  iVar3 = bottom_blob->d;
  uVar4 = bottom_blob->c;
  uVar27 = (ulong)uVar4;
  sVar7 = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    if (this->adaptive_pooling == 0) {
      local_188.cstep = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.allocator = (Allocator *)0x0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
      local_78.lightmode = opt->lightmode;
      local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
      local_78.num_threads = opt->num_threads;
      local_78.blob_allocator = opt->blob_allocator;
      local_78.workspace_allocator = opt->workspace_allocator;
      local_78.openmp_blocktime = opt->openmp_blocktime;
      local_78.use_winograd_convolution = opt->use_winograd_convolution;
      local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
      local_78.use_int8_inference = opt->use_int8_inference;
      local_78.use_vulkan_compute = opt->use_vulkan_compute;
      uVar26._0_1_ = opt->use_bf16_storage;
      uVar26._1_1_ = opt->use_fp16_packed;
      uVar26._2_1_ = opt->use_fp16_storage;
      uVar26._3_1_ = opt->use_fp16_arithmetic;
      uVar26._4_1_ = opt->use_int8_packed;
      uVar26._5_1_ = opt->use_int8_storage;
      uVar26._6_1_ = opt->use_int8_arithmetic;
      uVar26._7_1_ = opt->use_packing_layout;
      local_78.use_shader_pack8 = opt->use_shader_pack8;
      local_78.use_subgroup_basic = opt->use_subgroup_basic;
      local_78.use_subgroup_vote = opt->use_subgroup_vote;
      local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
      local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      local_78.use_image_storage = opt->use_image_storage;
      local_78.use_tensor_storage = opt->use_tensor_storage;
      local_78.use_weight_fp16_storage = opt->use_weight_fp16_storage;
      local_78.flush_denormals = opt->flush_denormals;
      local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
      local_78.use_reserved_1 = opt->use_reserved_1;
      local_78.use_reserved_2 = opt->use_reserved_2;
      local_78.use_reserved_3 = opt->use_reserved_3;
      local_78.use_reserved_4 = opt->use_reserved_4;
      local_78.use_reserved_5 = opt->use_reserved_5;
      local_78.use_reserved_6 = opt->use_reserved_6;
      local_78.use_reserved_7 = opt->use_reserved_7;
      local_78.use_reserved_8 = opt->use_reserved_8;
      local_78.use_reserved_9 = opt->use_reserved_9;
      local_78.use_reserved_10 = opt->use_reserved_10;
      local_78.use_reserved_11 = opt->use_reserved_11;
      local_78._32_8_ = uVar26 & 0xffffffffffffff;
      make_padding(this,bottom_blob,&local_188,&local_78);
      iVar2 = local_188.h;
      iVar20 = local_188.w;
      iVar25 = -100;
      if ((local_188.data != (void *)0x0) && ((long)local_188.c * local_188.cstep != 0)) {
        iVar12 = local_188.d;
        iVar3 = (local_188.w - this->kernel_w) / this->stride_w;
        iVar5 = (local_188.h - this->kernel_h) / this->stride_h;
        uVar34 = iVar3 + 1;
        uVar36 = iVar5 + 1;
        iVar6 = (local_188.d - this->kernel_d) / this->stride_d;
        Mat::create(top_blob,uVar34,uVar36,iVar6 + 1U,uVar4,sVar7,(Allocator *)0x0);
        iVar25 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          uVar26 = (long)this->kernel_d * (long)this->kernel_h * (long)this->kernel_w;
          std::vector<int,_std::allocator<int>_>::vector
                    (&local_90,uVar26,(allocator_type *)&local_120);
          iVar25 = this->kernel_d;
          if (0 < iVar25) {
            iVar35 = this->kernel_w;
            iVar30 = this->kernel_h;
            iVar14 = iVar20 - iVar35;
            iVar13 = iVar2 - iVar30;
            iVar31 = 0;
            iVar15 = 0;
            iVar33 = 0;
            do {
              if (0 < iVar30) {
                iVar25 = 0;
                do {
                  if (0 < iVar35) {
                    lVar17 = 0;
                    do {
                      local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar33 + lVar17] = iVar15 + (int)lVar17;
                      iVar35 = this->kernel_w;
                      lVar17 = lVar17 + 1;
                      iVar23 = (int)lVar17;
                    } while (iVar23 < iVar35);
                    iVar33 = iVar33 + iVar23;
                    iVar30 = this->kernel_h;
                    iVar15 = iVar15 + iVar23;
                  }
                  iVar15 = iVar15 + iVar14;
                  iVar25 = iVar25 + 1;
                } while (iVar25 < iVar30);
                iVar25 = this->kernel_d;
              }
              iVar15 = iVar15 + iVar13 * iVar20;
              iVar31 = iVar31 + 1;
            } while (iVar31 < iVar25);
          }
          iVar25 = (int)uVar26;
          if (this->pooling_type == 1) {
            if (this->avgpool_count_include_pad == 0) {
              iVar25 = 0;
              local_22c = 0;
              local_230 = 0;
              if (this->pad_mode == 0) {
                iVar25 = (bottom_blob->w - local_188.w) + this->pad_left + this->pad_right;
                local_22c = (bottom_blob->h - local_188.h) + this->pad_top + this->pad_bottom;
                local_230 = (bottom_blob->d - local_188.d) + this->pad_front + this->pad_behind;
              }
              if (0 < (int)uVar4) {
                uVar26 = 0;
                local_130 = (ulong)(iVar6 + 1U);
                do {
                  local_120.c = 1;
                  if (local_188.dims != 3) {
                    local_120.c = local_188.d;
                  }
                  local_120.dims = local_188.dims == 3 ^ 3;
                  local_120.elemsize =
                       CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
                  local_120.data =
                       (void *)(local_188.cstep * uVar26 * local_120.elemsize + (long)local_188.data
                               );
                  local_120.refcount = (int *)0x0;
                  local_120.elempack = local_188.elempack;
                  local_120.allocator = local_188.allocator;
                  local_120.w = local_188.w;
                  local_120.h = local_188.h;
                  local_120.cstep = (long)local_188.h * (long)local_188.w;
                  local_120.d = 1;
                  bVar40 = top_blob->dims == 3;
                  local_d8.c = 1;
                  if (!bVar40) {
                    local_d8.c = top_blob->d;
                  }
                  local_d8.w = top_blob->w;
                  local_d8.h = top_blob->h;
                  local_d8.elemsize = top_blob->elemsize;
                  local_238 = (void *)(top_blob->cstep * uVar26 * local_d8.elemsize +
                                      (long)top_blob->data);
                  local_d8.dims = bVar40 ^ 3;
                  local_d8.elempack = top_blob->elempack;
                  local_d8.allocator = top_blob->allocator;
                  local_d8.refcount = (int *)0x0;
                  local_d8.cstep = (long)local_d8.h * (long)local_d8.w;
                  local_d8.d = 1;
                  local_138 = uVar26;
                  local_d8.data = local_238;
                  Mat::~Mat(&local_d8);
                  if (-1 < iVar6) {
                    local_140 = (long)this->stride_d;
                    iVar35 = this->stride_h;
                    local_1a8 = 0;
                    uVar26 = 0;
                    do {
                      local_128 = uVar26;
                      if (-1 < iVar5) {
                        iVar30 = this->stride_w;
                        uVar4 = this->kernel_d;
                        local_1a0 = 0;
                        local_1c0 = 0;
                        do {
                          if (-1 < iVar3) {
                            iVar14 = this->pad_front;
                            local_220 = 0;
                            uVar26 = 0;
                            do {
                              fVar41 = NAN;
                              if (0 < (int)uVar4) {
                                lVar17 = (long)local_120.w * local_120.elemsize;
                                pvVar32 = (void *)((local_1a8 * local_120.h + local_1a0) * lVar17 +
                                                  (long)local_120.data);
                                fVar41 = 0.0;
                                uVar28 = 0;
                                iVar13 = 0;
                                do {
                                  lVar22 = local_128 * local_140 + uVar28;
                                  if (iVar14 <= lVar22) {
                                    if ((local_230 + iVar12) - this->pad_behind <= lVar22) break;
                                    if (0 < this->kernel_h) {
                                      uVar24 = 0;
                                      pvVar21 = pvVar32;
                                      do {
                                        lVar22 = uVar24 + local_1c0 * (long)iVar35;
                                        if (this->pad_top <= lVar22) {
                                          if ((local_22c + iVar2) - this->pad_bottom <= lVar22)
                                          break;
                                          uVar18 = (ulong)(uint)this->kernel_w;
                                          lVar22 = local_220;
                                          if (0 < this->kernel_w) {
                                            do {
                                              if (this->pad_left <= lVar22) {
                                                if ((iVar25 + iVar20) - this->pad_right <= lVar22)
                                                break;
                                                fVar41 = fVar41 + *(float *)((long)pvVar21 +
                                                                            lVar22 * 4);
                                                iVar13 = iVar13 + 1;
                                              }
                                              uVar18 = uVar18 - 1;
                                              lVar22 = lVar22 + 1;
                                            } while (uVar18 != 0);
                                          }
                                        }
                                        uVar24 = uVar24 + 1;
                                        pvVar21 = (void *)((long)pvVar21 + lVar17);
                                      } while (uVar24 != (uint)this->kernel_h);
                                    }
                                  }
                                  uVar28 = uVar28 + 1;
                                  pvVar32 = (void *)((long)pvVar32 + local_120.h * lVar17);
                                } while (uVar28 != uVar4);
                                fVar41 = fVar41 / (float)iVar13;
                              }
                              *(float *)((long)local_238 + uVar26 * 4) = fVar41;
                              uVar26 = uVar26 + 1;
                              local_220 = local_220 + iVar30;
                            } while (uVar26 != uVar34);
                          }
                          local_238 = (void *)((long)local_238 + (long)(int)uVar34 * 4);
                          local_1c0 = local_1c0 + 1;
                          local_1a0 = local_1a0 + iVar35;
                        } while (local_1c0 != uVar36);
                      }
                      local_1a8 = local_1a8 + local_140;
                      uVar26 = local_128 + 1;
                    } while (local_128 + 1 != local_130);
                  }
                  Mat::~Mat(&local_120);
                  uVar26 = local_138 + 1;
                } while (uVar26 != uVar27);
              }
            }
            else if (0 < (int)uVar4) {
              pvVar32 = top_blob->data;
              sVar7 = top_blob->cstep;
              sVar8 = top_blob->elemsize;
              lVar17 = (long)local_188.w *
                       CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
              local_218 = 0;
              do {
                if (-1 < iVar6) {
                  pvVar21 = (void *)(sVar7 * sVar8 * local_218 + (long)pvVar32);
                  iVar20 = 0;
                  do {
                    if (-1 < iVar5) {
                      iVar2 = this->stride_d;
                      iVar12 = this->stride_h;
                      iVar35 = this->stride_w;
                      uVar28 = 0;
                      do {
                        if (-1 < iVar3) {
                          uVar24 = 0;
                          do {
                            if (iVar25 < 1) {
                              fVar41 = 0.0;
                            }
                            else {
                              fVar41 = 0.0;
                              uVar18 = 0;
                              do {
                                fVar41 = fVar41 + *(float *)((long)local_188.data +
                                                            (long)local_90.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar18] *
                                                  4 + uVar24 * (long)iVar35 * 4 +
                                                      uVar28 * iVar12 * lVar17 +
                                                      (long)iVar20 * (long)iVar2 *
                                                      local_188.h * lVar17 +
                                                      local_188.cstep *
                                                      CONCAT44(local_188.elemsize._4_4_,
                                                               (undefined4)local_188.elemsize) *
                                                      local_218);
                                uVar18 = uVar18 + 1;
                              } while ((uVar26 & 0xffffffff) != uVar18);
                            }
                            *(float *)((long)pvVar21 + uVar24 * 4) = fVar41 * (1.0 / (float)iVar25);
                            uVar24 = uVar24 + 1;
                          } while (uVar24 != uVar34);
                        }
                        pvVar21 = (void *)((long)pvVar21 + (long)(int)uVar34 * 4);
                        uVar28 = uVar28 + 1;
                      } while (uVar28 != uVar36);
                    }
                    bVar40 = iVar20 != iVar6;
                    iVar20 = iVar20 + 1;
                  } while (bVar40);
                }
                local_218 = local_218 + 1;
              } while (local_218 != uVar27);
            }
          }
          else if ((this->pooling_type == 0) && (0 < (int)uVar4)) {
            pvVar32 = top_blob->data;
            sVar7 = top_blob->cstep;
            sVar8 = top_blob->elemsize;
            lVar17 = (long)local_188.w *
                     CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
            local_218 = 0;
            do {
              if (-1 < iVar6) {
                pvVar21 = (void *)(sVar7 * sVar8 * local_218 + (long)pvVar32);
                iVar20 = 0;
                do {
                  if (-1 < iVar5) {
                    iVar2 = this->stride_d;
                    iVar12 = this->stride_h;
                    iVar35 = this->stride_w;
                    uVar28 = 0;
                    do {
                      if (-1 < iVar3) {
                        lVar22 = uVar28 * iVar12 * lVar17 +
                                 (long)iVar20 * (long)iVar2 * local_188.h * lVar17 +
                                 local_188.cstep *
                                 CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize) *
                                 local_218;
                        uVar24 = 0;
                        do {
                          lVar16 = uVar24 * (long)iVar35;
                          fVar41 = *(float *)((long)local_188.data + lVar16 * 4 + lVar22);
                          if (0 < iVar25) {
                            uVar18 = 0;
                            do {
                              fVar1 = *(float *)((long)local_188.data +
                                                (long)local_90.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar18] *
                                                4 + lVar16 * 4 + lVar22);
                              if (fVar41 <= fVar1) {
                                fVar41 = fVar1;
                              }
                              uVar18 = uVar18 + 1;
                            } while ((uVar26 & 0xffffffff) != uVar18);
                          }
                          *(float *)((long)pvVar21 + uVar24 * 4) = fVar41;
                          uVar24 = uVar24 + 1;
                        } while (uVar24 != uVar34);
                      }
                      pvVar21 = (void *)((long)pvVar21 + (long)(int)uVar34 * 4);
                      uVar28 = uVar28 + 1;
                    } while (uVar28 != uVar36);
                  }
                  bVar40 = iVar20 != iVar6;
                  iVar20 = iVar20 + 1;
                } while (bVar40);
              }
              local_218 = local_218 + 1;
            } while (local_218 != uVar27);
          }
          if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          iVar25 = 0;
        }
      }
      piVar11 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (local_188.allocator == (Allocator *)0x0) {
            if (local_188.data != (void *)0x0) {
              free(local_188.data);
            }
          }
          else {
            (*(local_188.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      Mat::create(top_blob,this->out_w,this->out_h,this->out_d,uVar4,sVar7,opt->blob_allocator);
      pvVar32 = top_blob->data;
      iVar25 = -100;
      if ((pvVar32 != (void *)0x0) && (sVar7 = top_blob->cstep, (long)top_blob->c * sVar7 != 0)) {
        iVar25 = 0;
        if (this->pooling_type == 0) {
          if (0 < (int)uVar4) {
            sVar8 = bottom_blob->cstep;
            sVar9 = bottom_blob->elemsize;
            sVar10 = top_blob->elemsize;
            pvVar21 = bottom_blob->data;
            iVar5 = this->out_h;
            iVar6 = this->out_d;
            local_1f8 = 0;
            do {
              if (0 < iVar6) {
                lVar17 = sVar8 * sVar9 * local_1f8;
                local_240 = (void *)(sVar7 * sVar10 * local_1f8 + (long)pvVar32);
                uVar4 = this->out_w;
                iVar25 = 0;
                do {
                  uVar26 = (long)(iVar25 * iVar3) / (long)iVar6;
                  iVar25 = iVar25 + 1;
                  uVar34 = (iVar25 * iVar3 + iVar6 + -1) / iVar6;
                  if (0 < iVar5) {
                    iVar35 = (int)uVar26;
                    iVar12 = 0;
                    do {
                      uVar28 = (long)(iVar12 * iVar2) / (long)iVar5;
                      iVar12 = iVar12 + 1;
                      uVar36 = (iVar12 * iVar2 + iVar5 + -1) / iVar5;
                      if (0 < (int)uVar4) {
                        iVar30 = (int)uVar28;
                        uVar24 = 0;
                        do {
                          uVar19 = uVar26 & 0xffffffff;
                          iVar14 = (iVar20 * (int)uVar24) / (int)uVar4;
                          uVar18 = uVar24 + 1;
                          iVar13 = iVar14 + (iVar35 * iVar2 + iVar30) * iVar20;
                          fVar41 = *(float *)((long)pvVar21 + (long)iVar13 * 4 + lVar17);
                          if (iVar35 < (int)uVar34) {
                            iVar31 = (int)(iVar20 * (int)uVar18 + (uVar4 - 1)) / (int)uVar4;
                            do {
                              uVar39 = uVar28 & 0xffffffff;
                              iVar15 = iVar13;
                              if (iVar30 < (int)uVar36) {
                                do {
                                  lVar22 = (long)iVar31 - (long)iVar14;
                                  iVar33 = iVar15;
                                  if (iVar14 < iVar31) {
                                    do {
                                      fVar1 = *(float *)((long)pvVar21 + (long)iVar33 * 4 + lVar17);
                                      if (fVar41 <= fVar1) {
                                        fVar41 = fVar1;
                                      }
                                      iVar33 = iVar33 + 1;
                                      lVar22 = lVar22 + -1;
                                    } while (lVar22 != 0);
                                  }
                                  uVar38 = (int)uVar39 + 1;
                                  uVar39 = (ulong)uVar38;
                                  iVar15 = iVar15 + iVar20;
                                } while (uVar38 != uVar36);
                              }
                              uVar38 = (int)uVar19 + 1;
                              uVar19 = (ulong)uVar38;
                              iVar13 = iVar13 + iVar2 * iVar20;
                            } while (uVar38 != uVar34);
                          }
                          *(float *)((long)local_240 + uVar24 * 4) = fVar41;
                          uVar24 = uVar18;
                        } while (uVar18 != uVar4);
                      }
                      local_240 = (void *)((long)local_240 + (long)(int)uVar4 * 4);
                    } while (iVar12 != iVar5);
                  }
                } while (iVar25 != iVar6);
              }
              local_1f8 = local_1f8 + 1;
              iVar25 = 0;
            } while (local_1f8 != uVar27);
          }
        }
        else if ((this->pooling_type == 1) && (0 < (int)uVar4)) {
          sVar8 = bottom_blob->cstep;
          sVar9 = bottom_blob->elemsize;
          sVar10 = top_blob->elemsize;
          pvVar21 = bottom_blob->data;
          iVar5 = this->out_h;
          iVar6 = this->out_d;
          local_1f8 = 0;
          do {
            if (0 < iVar6) {
              local_210 = (void *)(sVar7 * sVar10 * local_1f8 + (long)pvVar32);
              uVar4 = this->out_w;
              iVar25 = 0;
              do {
                iVar35 = (iVar25 * iVar3) / iVar6;
                iVar25 = iVar25 + 1;
                iVar12 = (iVar25 * iVar3 + iVar6 + -1) / iVar6;
                if (0 < iVar5) {
                  iVar30 = 0;
                  do {
                    uVar26 = (long)(iVar30 * iVar2) / (long)iVar5;
                    iVar30 = iVar30 + 1;
                    uVar34 = (iVar30 * iVar2 + iVar5 + -1) / iVar5;
                    if (0 < (int)uVar4) {
                      iVar14 = (int)uVar26;
                      uVar28 = 0;
                      do {
                        iVar31 = (iVar20 * (int)uVar28) / (int)uVar4;
                        uVar24 = uVar28 + 1;
                        iVar13 = (int)((int)uVar24 * iVar20 + (uVar4 - 1)) / (int)uVar4;
                        fVar41 = 0.0;
                        if (iVar35 < iVar12) {
                          iVar33 = (iVar2 * iVar35 + iVar14) * iVar20 + iVar31;
                          iVar15 = iVar35;
                          do {
                            uVar18 = uVar26 & 0xffffffff;
                            iVar23 = iVar33;
                            if (iVar14 < (int)uVar34) {
                              do {
                                lVar17 = (long)iVar13 - (long)iVar31;
                                iVar37 = iVar23;
                                if (iVar31 < iVar13) {
                                  do {
                                    fVar41 = fVar41 + *(float *)((long)pvVar21 +
                                                                (long)iVar37 * 4 +
                                                                sVar8 * sVar9 * local_1f8);
                                    iVar37 = iVar37 + 1;
                                    lVar17 = lVar17 + -1;
                                  } while (lVar17 != 0);
                                }
                                uVar36 = (int)uVar18 + 1;
                                uVar18 = (ulong)uVar36;
                                iVar23 = iVar23 + iVar20;
                              } while (uVar36 != uVar34);
                            }
                            iVar15 = iVar15 + 1;
                            iVar33 = iVar33 + iVar2 * iVar20;
                          } while (iVar15 != iVar12);
                        }
                        *(float *)((long)local_210 + uVar28 * 4) =
                             fVar41 / ((float)(iVar13 - iVar31) *
                                      (float)(int)(uVar34 - iVar14) * (float)(iVar12 - iVar35));
                        uVar28 = uVar24;
                      } while (uVar24 != uVar4);
                    }
                    local_210 = (void *)((long)local_210 + (long)(int)uVar4 * 4);
                  } while (iVar30 != iVar5);
                }
              } while (iVar25 != iVar6);
            }
            local_1f8 = local_1f8 + 1;
            iVar25 = 0;
          } while (local_1f8 != uVar27);
        }
      }
    }
  }
  else {
    Mat::create(top_blob,uVar4,sVar7,opt->blob_allocator);
    pvVar32 = top_blob->data;
    iVar25 = -100;
    if ((pvVar32 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar34 = iVar2 * iVar20 * iVar3;
      if (this->pooling_type == 0) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        lVar17 = bottom_blob->cstep * bottom_blob->elemsize;
        pvVar21 = bottom_blob->data;
        uVar26 = 0;
        pvVar29 = pvVar21;
        do {
          fVar41 = *(float *)((long)pvVar21 + lVar17 * uVar26);
          if (0 < (int)uVar34) {
            uVar28 = 0;
            do {
              fVar1 = *(float *)((long)pvVar29 + uVar28 * 4);
              if (fVar41 <= fVar1) {
                fVar41 = fVar1;
              }
              uVar28 = uVar28 + 1;
            } while (uVar34 != uVar28);
          }
          *(float *)((long)pvVar32 + uVar26 * 4) = fVar41;
          uVar26 = uVar26 + 1;
          pvVar29 = (void *)((long)pvVar29 + lVar17);
        } while (uVar26 != uVar27);
      }
      else {
        if (this->pooling_type != 1) {
          return 0;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        sVar7 = bottom_blob->cstep;
        sVar8 = bottom_blob->elemsize;
        pvVar21 = bottom_blob->data;
        uVar26 = 0;
        do {
          fVar41 = 0.0;
          if (0 < (int)uVar34) {
            uVar28 = 0;
            do {
              fVar41 = fVar41 + *(float *)((long)pvVar21 + uVar28 * 4);
              uVar28 = uVar28 + 1;
            } while (uVar34 != uVar28);
          }
          *(float *)((long)pvVar32 + uVar26 * 4) = fVar41 * (1.0 / (float)(int)uVar34);
          uVar26 = uVar26 + 1;
          pvVar21 = (void *)((long)pvVar21 + sVar7 * sVar8);
        } while (uVar26 != uVar27);
      }
      iVar25 = 0;
    }
  }
  return iVar25;
}

Assistant:

int Pooling3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h * d;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max_value = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max_value = std::max(max_value, ptr[i]);
                }

                top_blob[q] = max_value;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        top_blob.create(out_w, out_h, out_d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + out_d - 1) / out_d;
                    for (int i = 0; i < out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                        for (int j = 0; j < out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + out_w - 1) / out_w;

                            float max_value = inptr[id0 * w * h + ih0 * w + iw0];

                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        max_value = std::max(max_value, inptr[id * w * h + ih * w + iw]);
                                    }
                                }
                            }

                            outptr[j] = max_value;
                        }

                        outptr += out_w;
                    }
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + out_d - 1) / out_d;
                    int dk = id1 - id0;
                    for (int i = 0; i < out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                        int hk = ih1 - ih0;
                        for (int j = 0; j < out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + out_w - 1) / out_w;
                            int wk = iw1 - iw0;

                            float sum = 0;
                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        sum += inptr[id * w * h + ih * w + iw];
                                    }
                                }
                            }

                            outptr[j] = sum / hk / wk / dk;
                        }

                        outptr += out_w;
                    }
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;
    int outd = (d - kernel_d) / stride_d + 1;

    top_blob.create(outw, outh, outd, channels, elemsize);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w - kernel_w;
        int gap1 = h * w - w * kernel_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += 1;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);
            for (int z = 0; z < outd; z++)
            {
                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        float max_value = sptr[0];

                        for (int l = 0; l < maxk; l++)
                        {
                            float val = sptr[space_ofs[l]];
                            max_value = std::max(max_value, val);
                        }

                        outptr[j] = max_value;
                    }

                    outptr += outw;
                }
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;
            int dtailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                dtailpad = bottom_blob_bordered.d - bottom_blob.d - pad_front - pad_behind;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    int sz0 = z * stride_d;

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            float sum = 0;
                            int area = 0;
                            for (int kd = 0; kd < kernel_d; kd++)
                            {
                                int sz = sz0 + kd;

                                if (sz < pad_front)
                                    continue;

                                if (sz >= d - pad_behind - dtailpad)
                                    break;

                                for (int ki = 0; ki < kernel_h; ki++)
                                {
                                    int sy = sy0 + ki;

                                    if (sy < pad_top)
                                        continue;

                                    if (sy >= h - pad_bottom - htailpad)
                                        break;

                                    for (int kj = 0; kj < kernel_w; kj++)
                                    {
                                        int sx = sx0 + kj;

                                        if (sx < pad_left)
                                            continue;

                                        if (sx >= w - pad_right - wtailpad)
                                            break;

                                        float val = m.depth(sz).row(sy)[sx];
                                        sum += val;
                                        area += 1;
                                    }
                                }
                            }

                            outptr[j] = sum / area;
                        }

                        outptr += outw;
                    }
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                            float sum = 0;

                            for (int l = 0; l < maxk; l++)
                            {
                                float val = sptr[space_ofs[l]];
                                sum += val;
                            }

                            outptr[j] = sum / maxk;
                        }

                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}